

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::appendFace(btSoftBody *this,int node0,int node1,int node2,Material *mat)

{
  int iVar1;
  Face *pFVar2;
  Node *pNVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  btScalar bVar4;
  btVector3 *unaff_retaddr;
  btVector3 *in_stack_00000008;
  Face *f;
  undefined4 in_stack_00000020;
  
  if (((in_ESI != in_EDX) && (in_EDX != in_ECX)) && (in_ECX != in_ESI)) {
    appendFace(this,node0,(Material *)CONCAT44(node2,in_stack_00000020));
    iVar1 = btAlignedObjectArray<btSoftBody::Face>::size
                      ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
    pFVar2 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),iVar1 + -1);
    pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),in_ESI);
    pFVar2->m_n[0] = pNVar3;
    pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),in_EDX);
    pFVar2->m_n[1] = pNVar3;
    pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),in_ECX);
    pFVar2->m_n[2] = pNVar3;
    bVar4 = AreaOf((btVector3 *)f,in_stack_00000008,unaff_retaddr);
    pFVar2->m_ra = bVar4;
    *(undefined1 *)(in_RDI + 0x4b4) = 1;
  }
  return;
}

Assistant:

void			btSoftBody::appendFace(int node0,int node1,int node2,Material* mat)
{
	if (node0==node1)
		return;
	if (node1==node2)
		return;
	if (node2==node0)
		return;

	appendFace(-1,mat);
	Face&	f=m_faces[m_faces.size()-1];
	btAssert(node0!=node1);
	btAssert(node1!=node2);
	btAssert(node2!=node0);
	f.m_n[0]	=	&m_nodes[node0];
	f.m_n[1]	=	&m_nodes[node1];
	f.m_n[2]	=	&m_nodes[node2];
	f.m_ra		=	AreaOf(	f.m_n[0]->m_x,
		f.m_n[1]->m_x,
		f.m_n[2]->m_x);	
	m_bUpdateRtCst=true;
}